

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DataTypeSyntax *node;
  NetPortHeaderSyntax *pNVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  Info *args_2;
  Token *args_1;
  
  args_1 = (Token *)__child_stack;
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  args_2 = TVar2.info;
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  node = TVar2._0_8_;
  not_null<slang::syntax::DataTypeSyntax_*>::operator*
            ((not_null<slang::syntax::DataTypeSyntax_*> *)0x7bb47f);
  deepClone<slang::syntax::DataTypeSyntax>(node,(BumpAllocator *)__child_stack);
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NetPortHeaderSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::DataTypeSyntax&>
                     (unaff_retaddr,(Token *)__fn,args_1,(DataTypeSyntax *)args_2);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NetPortHeaderSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NetPortHeaderSyntax>(
        node.direction.deepClone(alloc),
        node.netType.deepClone(alloc),
        *deepClone<DataTypeSyntax>(*node.dataType, alloc)
    );
}